

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_AigerWriteLut(Gia_Man_t *p,char *pFileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 *__ptr;
  Vec_Wrd_t *vTruths_00;
  Gia_Obj_t *pGVar7;
  int *piVar8;
  word wVar9;
  FILE *__s;
  size_t sVar10;
  bool bVar11;
  int nSize2;
  int nSize1;
  FILE *pFile;
  Vec_Wrd_t *vTruths;
  Gia_MapLut_t *pLuts;
  int nLuts;
  int nUints;
  int LutSizeMax;
  int iLut;
  int iFan;
  int k;
  int i;
  Gia_Obj_t *pObj;
  char *pFileName_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManLutSizeMax(p);
  iVar2 = Abc_TruthWordNum(iVar1);
  iVar3 = Gia_ManCiNum(p);
  iVar4 = Gia_ManCoNum(p);
  iVar5 = Gia_ManLutNum(p);
  iVar5 = iVar3 + 1 + iVar4 + iVar5;
  __ptr = (undefined4 *)calloc((long)iVar5,0x54);
  iVar3 = Gia_ManObjNum(p);
  vTruths_00 = Vec_WrdStart(iVar3);
  if (6 < iVar1) {
    __assert_fail("LutSizeMax <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaUtil.c"
                  ,0x7fd,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
  }
  *__ptr = 3;
  memset(__ptr + 0xd,0xff,(long)iVar2 << 2);
  Gia_ManFillValue(p);
  uVar6 = Abc_Var2Lit(0,0);
  __ptr[1] = uVar6;
  pGVar7 = Gia_ManConst0(p);
  pGVar7->Value = uVar6;
  nUints = 1;
  iFan = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar11 = false;
    if (iFan < iVar1) {
      _k = Gia_ManCi(p,iFan);
      bVar11 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    __ptr[(long)nUints * 0x15] = 1;
    memset(__ptr + (long)nUints * 0x15 + 0xd,0xaa,(long)iVar2 << 2);
    uVar6 = Abc_Var2Lit(nUints,0);
    __ptr[(long)nUints * 0x15 + 1] = uVar6;
    _k->Value = uVar6;
    nUints = nUints + 1;
    iFan = iFan + 1;
  }
  iFan = 0;
  while( true ) {
    bVar11 = false;
    if (iFan < p->nObjs) {
      _k = Gia_ManObj(p,iFan);
      bVar11 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    if ((iFan != 0) && (iVar1 = Gia_ObjIsLut(p,iFan), iVar1 != 0)) {
      __ptr[(long)nUints * 0x15] = 3;
      for (iLut = 0; iVar1 = Gia_ObjLutSize(p,iFan), iLut < iVar1; iLut = iLut + 1) {
        piVar8 = Gia_ObjLutFanins(p,iFan);
        pGVar7 = Gia_ManObj(p,piVar8[iLut]);
        __ptr[(long)nUints * 0x15 + (long)iLut + 5] = pGVar7->Value;
      }
      __ptr[(long)nUints * 0x15 + 3] = iLut;
      wVar9 = Gia_LutComputeTruth6(p,iFan,vTruths_00);
      *(word *)(__ptr + (long)nUints * 0x15 + 0xd) = wVar9;
      uVar6 = Abc_Var2Lit(nUints,0);
      __ptr[(long)nUints * 0x15 + 1] = uVar6;
      _k->Value = uVar6;
      nUints = nUints + 1;
    }
    iFan = iFan + 1;
  }
  iFan = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar11 = false;
    if (iFan < iVar1) {
      _k = Gia_ManCo(p,iFan);
      bVar11 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar11) break;
    __ptr[(long)nUints * 0x15] = 2;
    pGVar7 = Gia_ObjFanin0(_k);
    __ptr[(long)nUints * 0x15 + 5] = pGVar7->Value;
    iVar1 = Gia_ObjFaninC0(_k);
    pGVar7 = Gia_ObjFanin0(_k);
    iVar3 = Gia_ObjIsConst0(pGVar7);
    if (iVar1 == iVar3) {
      memset(__ptr + (long)nUints * 0x15 + 0xd,0xaa,(long)iVar2 << 2);
    }
    else {
      memset(__ptr + (long)nUints * 0x15 + 0xd,0x55,(long)iVar2 << 2);
    }
    __ptr[(long)nUints * 0x15 + 3] = 1;
    uVar6 = Abc_Var2Lit(nUints,0);
    __ptr[(long)nUints * 0x15 + 1] = uVar6;
    _k->Value = uVar6;
    nUints = nUints + 1;
    iFan = iFan + 1;
  }
  if (nUints == iVar5) {
    __s = fopen(pFileName,"wb");
    if (__s == (FILE *)0x0) {
      printf("Cannot open file \"%s\" for writing.\n",pFileName);
    }
    else {
      uVar6 = iVar5 * 0x54;
      sVar10 = fwrite(__ptr,1,(long)(int)uVar6,__s);
      if (uVar6 != (uint)sVar10) {
        __assert_fail("nSize1 == nSize2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaUtil.c"
                      ,0x830,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
      }
      printf("Successfully dumped %d bytes of binary data.\n",(ulong)uVar6);
    }
    fclose(__s);
    if (__ptr != (undefined4 *)0x0) {
      free(__ptr);
    }
    Vec_WrdFree(vTruths_00);
    return;
  }
  __assert_fail("iLut == nLuts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaUtil.c"
                ,0x826,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
}

Assistant:

void Gia_AigerWriteLut( Gia_Man_t * p, char * pFileName )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, iLut = 0;
    int LutSizeMax = Gia_ManLutSizeMax( p );
    int nUints = Abc_TruthWordNum(LutSizeMax);
    int nLuts = 1 + Gia_ManCiNum(p) + Gia_ManCoNum(p) + Gia_ManLutNum(p);
    Gia_MapLut_t * pLuts = ABC_CALLOC( Gia_MapLut_t, nLuts );
    Vec_Wrd_t * vTruths = Vec_WrdStart( Gia_ManObjNum(p) );
    assert( LutSizeMax <= 6 );
    // set obj numbers
    // constant
    pLuts->Type = 3;
    memset( pLuts->pTruth, 0xFF, sizeof(unsigned) * nUints );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
    iLut++;
    // inputs
    Gia_ManForEachCi( p, pObj, i )
    {
        pLuts[iLut].Type = 1;
        memset( pLuts[iLut].pTruth, 0xAA, sizeof(unsigned) * nUints );
        pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
        iLut++;
    }
    // nodes
    Gia_ManForEachObj( p, pObj, i )
        if ( i && Gia_ObjIsLut(p, i) )
        {
            pLuts[iLut].Type = 3;
            Gia_LutForEachFanin( p, i, iFan, k )
                pLuts[iLut].pFans[k] = Gia_ManObj(p, iFan)->Value;
            pLuts[iLut].nFans = k;
            *(word *)pLuts[iLut].pTruth = Gia_LutComputeTruth6(p, i, vTruths);
            pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
            iLut++;
        }
    // outputs
    Gia_ManForEachCo( p, pObj, i )
    {
        pLuts[iLut].Type = 2;
        pLuts[iLut].pFans[0] = Gia_ObjFanin0(pObj)->Value;
        if ( Gia_ObjFaninC0(pObj) ^ Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            memset( pLuts[iLut].pTruth, 0x55, sizeof(unsigned) * nUints );
        else
            memset( pLuts[iLut].pTruth, 0xAA, sizeof(unsigned) * nUints );
        pLuts[iLut].nFans = 1;
        pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
        iLut++;
    }
    assert( iLut == nLuts );
    // dump into a file
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            int nSize1 = nLuts * sizeof(Gia_MapLut_t);
            int nSize2 = fwrite( pLuts, 1, nSize1, pFile );
            assert( nSize1 == nSize2 );
            printf( "Successfully dumped %d bytes of binary data.\n", nSize1 );
        }
        fclose( pFile );
    }
    ABC_FREE( pLuts );
    Vec_WrdFree( vTruths );
}